

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QNetworkAuthenticationCredential>::moveAppend
          (QGenericArrayOps<QNetworkAuthenticationCredential> *this,
          QNetworkAuthenticationCredential *b,QNetworkAuthenticationCredential *e)

{
  QNetworkAuthenticationCredential *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).size;
    do {
      pDVar2 = (b->domain).d.d;
      (b->domain).d.d = (Data *)0x0;
      pQVar1[qVar5].domain.d.d = pDVar2;
      pcVar3 = (b->domain).d.ptr;
      (b->domain).d.ptr = (char16_t *)0x0;
      pQVar1[qVar5].domain.d.ptr = pcVar3;
      qVar4 = (b->domain).d.size;
      (b->domain).d.size = 0;
      pQVar1[qVar5].domain.d.size = qVar4;
      pDVar2 = (b->user).d.d;
      (b->user).d.d = (Data *)0x0;
      pQVar1[qVar5].user.d.d = pDVar2;
      pcVar3 = (b->user).d.ptr;
      (b->user).d.ptr = (char16_t *)0x0;
      pQVar1[qVar5].user.d.ptr = pcVar3;
      qVar4 = (b->user).d.size;
      (b->user).d.size = 0;
      pQVar1[qVar5].user.d.size = qVar4;
      pDVar2 = (b->password).d.d;
      (b->password).d.d = (Data *)0x0;
      pQVar1[qVar5].password.d.d = pDVar2;
      pcVar3 = (b->password).d.ptr;
      (b->password).d.ptr = (char16_t *)0x0;
      pQVar1[qVar5].password.d.ptr = pcVar3;
      qVar4 = (b->password).d.size;
      (b->password).d.size = 0;
      pQVar1[qVar5].password.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).size + 1;
      (this->super_QArrayDataPointer<QNetworkAuthenticationCredential>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }